

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doGetUsedFuncs(Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *this,FuncSet *dst)

{
  ExprBase *pEVar1;
  FuncSet *dst_local;
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_4,_3>,_tcu::Vector<float,_4>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  FuncBase::getUsedFuncs((FuncBase *)this->m_func,dst);
  pEVar1 = &de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>::
            operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>
                        *)&this->m_args)->super_ExprBase;
  ExprBase::getUsedFuncs(pEVar1,dst);
  pEVar1 = &de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>::
            operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>
                        *)&(this->m_args).b)->super_ExprBase;
  ExprBase::getUsedFuncs(pEVar1,dst);
  pEVar1 = &de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&(this->m_args).c)->super_ExprBase;
  ExprBase::getUsedFuncs(pEVar1,dst);
  pEVar1 = &de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&(this->m_args).d)->super_ExprBase;
  ExprBase::getUsedFuncs(pEVar1,dst);
  return;
}

Assistant:

void				doGetUsedFuncs	(FuncSet& dst) const
	{
		m_func.getUsedFuncs(dst);
		m_args.a->getUsedFuncs(dst);
		m_args.b->getUsedFuncs(dst);
		m_args.c->getUsedFuncs(dst);
		m_args.d->getUsedFuncs(dst);
	}